

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O3

OPJ_OFF_T opj_stream_get_number_byte_left(opj_stream_private_t *p_stream)

{
  ulong uVar1;
  ulong uVar2;
  OPJ_OFF_T OVar3;
  
  uVar1 = p_stream->m_byte_offset;
  if ((long)uVar1 < 0) {
    __assert_fail("p_stream->m_byte_offset >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/cio.c"
                  ,0x24a,"OPJ_OFF_T opj_stream_get_number_byte_left(const opj_stream_private_t *)");
  }
  uVar2 = p_stream->m_user_data_length;
  OVar3 = uVar2 - uVar1;
  if (uVar1 <= uVar2) {
    if (uVar2 == 0) {
      OVar3 = 0;
    }
    return OVar3;
  }
  __assert_fail("p_stream->m_user_data_length >= (OPJ_UINT64)p_stream->m_byte_offset",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/cio.c"
                ,0x24b,"OPJ_OFF_T opj_stream_get_number_byte_left(const opj_stream_private_t *)");
}

Assistant:

OPJ_OFF_T opj_stream_get_number_byte_left(const opj_stream_private_t * p_stream)
{
    assert(p_stream->m_byte_offset >= 0);
    assert(p_stream->m_user_data_length >= (OPJ_UINT64)p_stream->m_byte_offset);
    return p_stream->m_user_data_length ?
           (OPJ_OFF_T)(p_stream->m_user_data_length) - p_stream->m_byte_offset :
           0;
}